

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QModelIndex *mi)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  QAbstractItemModel *pQVar4;
  undefined8 uVar5;
  Picker *this_00;
  QModelIndex local_58;
  QModelIndex local_40;
  
  local_58.r = -1;
  local_58.c = -1;
  local_58.i = 0;
  local_58.m = (QAbstractItemModel *)0x0;
  iVar1 = this->modelColumn;
  if (mi->c != iVar1) {
    pQVar3 = this->model;
    iVar2 = mi->r;
    pQVar4 = mi->m;
    if (pQVar4 == (QAbstractItemModel *)0x0) {
      local_40.r = -1;
      local_40.c = -1;
      local_40.i = 0;
      local_40.m = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar4 + 0x68))(&local_40,pQVar4,mi);
    }
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_58,pQVar3,iVar2,iVar1,&local_40);
  }
  if (((local_58.r < 0) || ((long)local_58._0_8_ < 0)) || (local_58.m == (QAbstractItemModel *)0x0))
  {
    local_58.m = mi->m;
    local_58.r = mi->r;
    local_58.c = mi->c;
    local_58.i = mi->i;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&this->currentIndex);
  if (((local_40.r != local_58.r) || (local_40.i != local_58.i)) ||
     ((local_40.c != local_58.c || (local_40.m != local_58.m)))) {
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_40,&local_58);
    uVar5 = *(undefined8 *)&this->currentIndex;
    *(undefined8 *)&this->currentIndex = local_40._0_8_;
    local_40._0_8_ = uVar5;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_40);
    QWidget::update();
    this_00 = this->q;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&this->currentIndex);
    Picker::_q_emitCurrentIndexChanged(this_00,&local_40);
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QModelIndex & mi )
{
	QModelIndex normalized;

	if( mi.column() != modelColumn )
		normalized = model->index( mi.row(), modelColumn, mi.parent() );

	if( !normalized.isValid() )
		normalized = mi;    // Fallback to passed index.

	bool indexChanged = ( normalized != currentIndex );

	if( indexChanged )
	{
		currentIndex = QPersistentModelIndex( normalized );
		q->update();
		q->_q_emitCurrentIndexChanged( currentIndex );
	}
}